

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::ImportWriter::ImportWriter
          (ImportWriter *this,string *generate_for_named_framework,
          string *named_framework_to_proto_path_mappings_path)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  (this->generate_for_named_framework_)._M_dataplus._M_p =
       (pointer)&(this->generate_for_named_framework_).field_2;
  pcVar2 = (generate_for_named_framework->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar2,pcVar2 + generate_for_named_framework->_M_string_length);
  (this->named_framework_to_proto_path_mappings_path_)._M_dataplus._M_p =
       (pointer)&(this->named_framework_to_proto_path_mappings_path_).field_2;
  pcVar2 = (named_framework_to_proto_path_mappings_path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->named_framework_to_proto_path_mappings_path_,pcVar2,
             pcVar2 + named_framework_to_proto_path_mappings_path->_M_string_length);
  p_Var1 = &(this->proto_file_to_framework_name_)._M_t._M_impl.super__Rb_tree_header;
  (this->proto_file_to_framework_name_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->proto_file_to_framework_name_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->proto_file_to_framework_name_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->proto_file_to_framework_name_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->proto_file_to_framework_name_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->need_to_parse_mapping_file_ = true;
  (this->protobuf_framework_imports_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->protobuf_framework_imports_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->protobuf_framework_imports_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->protobuf_non_framework_imports_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->protobuf_non_framework_imports_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->protobuf_non_framework_imports_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->other_framework_imports_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->other_framework_imports_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->other_framework_imports_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->other_imports_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->other_imports_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->other_imports_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ImportWriter::ImportWriter(
  const string& generate_for_named_framework,
  const string& named_framework_to_proto_path_mappings_path)
    : generate_for_named_framework_(generate_for_named_framework),
      named_framework_to_proto_path_mappings_path_(
          named_framework_to_proto_path_mappings_path),
      need_to_parse_mapping_file_(true) {
}